

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O0

void SVRG::predict(svrg *s,single_learner *param_2,example *ec)

{
  example *in_RDX;
  vw *in_RSI;
  float fVar1;
  
  fVar1 = inline_predict<0>(in_RSI,in_RDX);
  in_RDX->partial_prediction = fVar1;
  fVar1 = GD::finalize_prediction((shared_data *)in_RDX,0.0);
  (in_RDX->pred).scalar = fVar1;
  return;
}

Assistant:

void predict(svrg& s, single_learner&, example& ec)
{
  ec.partial_prediction = inline_predict<W_INNER>(*s.all, ec);
  ec.pred.scalar = GD::finalize_prediction(s.all->sd, ec.partial_prediction);
}